

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O2

void __thiscall
asl::WebSocketServer::process(WebSocketServer *this,Socket *client,Dic<asl::String> *headers)

{
  Mutex *__mutex;
  bool bVar1;
  String *pSVar2;
  Lock l;
  undefined1 local_d0 [8];
  WebSocket ws;
  String digest;
  String key;
  String local_60;
  Hash hash;
  
  String::String((String *)&ws,"Upgrade");
  bVar1 = Map<asl::String,_asl::String>::has
                    (&headers->super_Map<asl::String,_asl::String>,(String *)&ws);
  if (bVar1) {
    String::String(&key,"Upgrade");
    pSVar2 = Map<asl::String,_asl::String>::operator[]
                       (&headers->super_Map<asl::String,_asl::String>,&key);
    bVar1 = String::operator!=(pSVar2,"websocket");
    if (!bVar1) {
      String::String(&digest,"Connection");
      pSVar2 = Map<asl::String,_asl::String>::operator[]
                         (&headers->super_Map<asl::String,_asl::String>,&digest);
      String::String((String *)&hash,", ");
      String::split((String *)local_d0,pSVar2);
      String::String(&local_60,"Upgrade");
      bVar1 = Array<asl::String>::contains((Array<asl::String> *)local_d0,&local_60);
      String::~String(&local_60);
      Array<asl::String>::~Array((Array<asl::String> *)local_d0);
      String::~String((String *)&hash);
      String::~String(&digest);
      String::~String(&key);
      String::~String((String *)&ws);
      if (bVar1) {
        String::String((String *)&ws,"Sec-Websocket-Key");
        pSVar2 = Map<asl::String,_asl::String>::operator[]
                           (&headers->super_Map<asl::String,_asl::String>,(String *)&ws);
        String::String(&key,pSVar2);
        String::~String((String *)&ws);
        String::operator+((String *)&ws,&key,"258EAFA5-E914-47DA-95CA-C5AB0DC85B11");
        SHA1::hash(&hash,(String *)&ws);
        String::~String((String *)&ws);
        encodeBase64(&digest,hash._a,0x14);
        if (digest._size == 0) {
          digest.field_2._str = (char *)&digest.field_2;
        }
        String::String((String *)&ws,0xb4,
                       "HTTP/1.1 101 Switching Protocols\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: %s\r\n"
                       ,digest.field_2._str);
        Socket::operator<<(client,(String *)&ws);
        String::~String((String *)&ws);
        String::String((String *)&ws,"Sec-Websocket-Protocol");
        bVar1 = Map<asl::String,_asl::String>::has
                          (&headers->super_Map<asl::String,_asl::String>,(String *)&ws);
        String::~String((String *)&ws);
        if (bVar1) {
          Socket::operator<<(client,"Sec-Websocket-Protocol: chat\r\n");
        }
        Socket::operator<<(client,"\r\n");
        WebSocket::WebSocket(&ws,client,false);
        __mutex = &this->_mutex;
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        local_60._0_8_ = &ws;
        Array<asl::WebSocket_*>::operator<<(&this->_clients,(WebSocket **)&local_60);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        (*(this->super_SocketServer)._vptr_SocketServer[1])(this,&ws);
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        local_60._0_8_ = &ws;
        Array<asl::WebSocket_*>::removeOne(&this->_clients,(WebSocket **)&local_60,0);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        (*((client->super_SmartObject)._p)->_vptr_SmartObject_[0xb])();
        WebSocket::~WebSocket(&ws);
        String::~String(&digest);
        String::~String(&key);
        return;
      }
      goto LAB_0012c4c0;
    }
    String::~String(&key);
  }
  String::~String((String *)&ws);
LAB_0012c4c0:
  Socket::operator<<(client,"HTTP/1.1 400 Bad request\r\n\r\nNot a WebSocket request");
  return;
}

Assistant:

void WebSocketServer::process(Socket& client, const Dic<String>& headers)
{
	if (!headers.has("Upgrade") || headers["Upgrade"] != "websocket" || !headers["Connection"].split(", ").contains("Upgrade"))
	{
		client << "HTTP/1.1 400 Bad request\r\n\r\nNot a WebSocket request";
		return;
	}

	String key = headers["Sec-Websocket-Key"];

	SHA1::Hash hash = SHA1::hash(key + "258EAFA5-E914-47DA-95CA-C5AB0DC85B11");
	String digest = encodeBase64(hash, hash.length());

	client << String(180, "HTTP/1.1 101 Switching Protocols\r\n"
		"Upgrade: websocket\r\n"
		"Connection: Upgrade\r\n"
		"Sec-WebSocket-Accept: %s\r\n", *digest);

	if (headers.has("Sec-Websocket-Protocol"))
		client << "Sec-Websocket-Protocol: chat\r\n";
	client << "\r\n";

	WebSocket ws(client, false);
	{
		Lock l(_mutex);
		_clients << &ws;
	}
	serve(ws);
	{
		Lock l(_mutex);
		_clients.removeOne(&ws);
	}
	client.close();
}